

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_Prepare
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags,
                   uint32_t dwPlayOffset,uint8_t nLoopCount,FACTWave **ppWave)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint *puVar5;
  undefined8 uVar6;
  int in_ECX;
  code *pcVar7;
  ushort in_SI;
  long *in_RDI;
  undefined1 in_R8B;
  long *in_R9;
  bool bVar8;
  double dVar9;
  SDL_AssertState sdl_assert_state_5;
  SDL_AssertState sdl_assert_state_4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FACTSeekTable *seek;
  FACTWaveBankEntry *entry;
  anon_union_52_3_52b89101 format;
  FAudioSendDescriptor send;
  FAudioVoiceSends sends;
  FAudioBufferWMA bufferWMA;
  FAudioBuffer buffer;
  uint local_dc;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  LinkedList **in_stack_ffffffffffffff40;
  short local_ac;
  ushort local_a0;
  ushort local_9a;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 uVar10;
  undefined4 uVar11;
  FAudioVoiceCallback *callback;
  FAudioVoiceCallback *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  FAudioEffectChain *in_stack_ffffffffffffffd0;
  uint32_t local_4;
  
  if (in_RDI == (long *)0x0) {
    *in_R9 = 0;
    local_4 = 1;
  }
  else {
    lVar4 = (**(code **)(*in_RDI + 200))(0x90);
    *in_R9 = lVar4;
    FAudio_PlatformLockMutex((FAudioMutex)0x11556c);
    puVar5 = (uint *)(in_RDI[7] + (ulong)in_SI * 0x18);
    *(long **)*in_R9 = in_RDI;
    *(undefined8 *)(*in_R9 + 8) = 0;
    *(ushort *)(*in_R9 + 0x10) = in_SI;
    *(undefined1 *)(*in_R9 + 0x12) = 0;
    *(undefined8 *)(*in_R9 + 0x18) = 0;
    *(undefined4 *)(*in_R9 + 0x20) = 4;
    *(undefined4 *)(*in_R9 + 0x24) = 0x3f800000;
    *(undefined2 *)(*in_R9 + 0x28) = 0;
    *(undefined1 *)(*in_R9 + 0x2a) = in_R8B;
    local_dc = in_stack_ffffffffffffff68;
    do {
      if (in_ECX == 0) goto LAB_0011568b;
      in_stack_ffffffffffffff3c =
           SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data,"FACTWaveBank_Prepare",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                               ,0x70a);
    } while (in_stack_ffffffffffffff3c == 0);
    if (in_stack_ffffffffffffff3c == 1) {
      pcVar7 = (code *)swi(3);
      uVar3 = (*pcVar7)();
      return uVar3;
    }
LAB_0011568b:
    local_78 = 0;
    local_74 = (undefined4)*(undefined8 *)(*in_RDI + 0xa0);
    uVar10 = (undefined4)((ulong)*(undefined8 *)(*in_RDI + 0xa0) >> 0x20);
    uVar11 = 1;
    callback = (FAudioVoiceCallback *)&local_78;
    uVar1 = (ushort)(puVar5[1] >> 2) & 7;
    uVar2 = puVar5[1] >> 5 & 0x3ffff;
    if ((puVar5[1] & 3) == 0) {
      local_ac = 1;
      local_a0 = (ushort)(((uint)uVar1 * (8 << (byte)(puVar5[1] >> 0x1f) & 0xffffU)) / 8);
    }
    else if ((puVar5[1] & 3) == 1) {
      do {
        if ((int)puVar5[1] < 0) goto LAB_001157b3;
        in_stack_ffffffffffffff38 =
             SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data_1,"FACTWaveBank_Prepare",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                 ,0x740);
      } while (in_stack_ffffffffffffff38 == 0);
      if (in_stack_ffffffffffffff38 == 1) {
        pcVar7 = (code *)swi(3);
        uVar3 = (*pcVar7)();
        return uVar3;
      }
LAB_001157b3:
      in_stack_ffffffffffffff40 = (LinkedList **)(in_RDI[9] + (ulong)in_SI * 0x10);
      local_ac = 0x166;
      local_a0 = (ushort)aWMABlockAlign[(int)(puVar5[1] >> 0x17 & 0x1f)];
      local_9a = (ushort)((ulong)(uVar1 + 1) / 2);
      if (uVar1 < 2) {
        local_dc = 0;
      }
      else {
        local_dc = 0xffffffff >> (0x20U - (char)uVar1 & 0x1f);
      }
      in_stack_ffffffffffffff6c =
           *(undefined4 *)
            ((long)&in_stack_ffffffffffffff40[1]->entry +
            (ulong)(*(uint *)in_stack_ffffffffffffff40 - 1) * 4);
      dVar9 = (double)SDL_ceil(((double)puVar5[3] / (double)*(uint *)in_stack_ffffffffffffff40) *
                               0.00048828125);
      in_stack_ffffffffffffff70 = ((int)dVar9 & 0xffffU) << 0xb;
      in_stack_ffffffffffffff7c = 0;
      in_stack_ffffffffffffff74 = 0;
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffff6c;
    }
    else if ((puVar5[1] & 3) == 2) {
      local_ac = 2;
      local_a0 = (((ushort)(puVar5[1] >> 0x17) & 0xff) + 0x16) * uVar1;
      local_9a = ((short)((ulong)local_a0 / (ulong)(long)(int)(uint)uVar1) + -6) * 2;
    }
    else if ((puVar5[1] & 3) == 3) {
      do {
        if (-1 < (int)puVar5[1]) goto LAB_001159cc;
        in_stack_ffffffffffffff34 =
             SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data_2,"FACTWaveBank_Prepare",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                 ,0x769);
      } while (in_stack_ffffffffffffff34 == 0);
      if (in_stack_ffffffffffffff34 == 1) {
        pcVar7 = (code *)swi(3);
        uVar3 = (*pcVar7)();
        return uVar3;
      }
LAB_001159cc:
      local_ac = 0x161;
      local_a0 = (ushort)aWMABlockAlign[(int)(puVar5[1] >> 0x17 & 0x1f)];
    }
    else {
      do {
        in_stack_ffffffffffffff30 =
             SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data_3,"FACTWaveBank_Prepare",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                 ,0x773);
      } while (in_stack_ffffffffffffff30 == 0);
      if (in_stack_ffffffffffffff30 == 1) {
        pcVar7 = (code *)swi(3);
        uVar3 = (*pcVar7)();
        return uVar3;
      }
    }
    pcVar7 = (code *)0x0;
    if (*(short *)((long)in_RDI + 0x5c) != 0) {
      pcVar7 = FACT_INTERNAL_OnBufferEnd;
    }
    *(code **)(*in_R9 + 0x50) = pcVar7;
    *(undefined8 *)(*in_R9 + 0x58) = 0;
    *(undefined8 *)(*in_R9 + 0x60) = 0;
    *(code **)(*in_R9 + 0x68) = FACT_INTERNAL_OnStreamEnd;
    *(undefined8 *)(*in_R9 + 0x70) = 0;
    *(undefined8 *)(*in_R9 + 0x78) = 0;
    *(undefined8 *)(*in_R9 + 0x80) = 0;
    *(long *)(*in_R9 + 0x88) = *in_R9;
    *(ushort *)(*in_R9 + 0x40) = uVar1;
    FAudio_CreateSourceVoice
              ((FAudio *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (FAudioSourceVoice **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (FAudioWaveFormatEx *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (FAudioVoiceSends *)callback,in_stack_ffffffffffffffd0);
    if (*(short *)((long)in_RDI + 0x5c) == 0) {
      *(undefined8 *)(*in_R9 + 0x38) = 0;
      FAudio_memptr((FAudioIOStream *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (local_ac == 0x161) {
        FAudioSourceVoice_SubmitSourceBuffer
                  ((FAudioSourceVoice *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (FAudioBuffer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (FAudioBufferWMA *)CONCAT44(in_stack_ffffffffffffff6c,local_dc));
      }
      else {
        FAudioSourceVoice_SubmitSourceBuffer
                  ((FAudioSourceVoice *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (FAudioBuffer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (FAudioBufferWMA *)CONCAT44(in_stack_ffffffffffffff6c,local_dc));
      }
    }
    else {
      if (local_ac == 1) {
        *(uint *)(*in_R9 + 0x2c) = uVar2 * local_a0;
      }
      else if (local_ac == 2) {
        *(uint *)(*in_R9 + 0x2c) = (uVar2 / local_9a) * (uint)local_a0;
      }
      else {
        *(uint *)(*in_R9 + 0x2c) = puVar5[3];
        do {
          if (puVar5[4] == 0) goto LAB_00115c7a;
          in_stack_ffffffffffffff2c =
               SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data_4,"FACTWaveBank_Prepare",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                   ,0x7a2);
        } while (in_stack_ffffffffffffff2c == 0);
        if (in_stack_ffffffffffffff2c == 1) {
          pcVar7 = (code *)swi(3);
          uVar3 = (*pcVar7)();
          return uVar3;
        }
LAB_00115c7a:
        do {
          bVar8 = true;
          if (puVar5[5] != 0) {
            bVar8 = puVar5[5] == *puVar5 >> 4;
          }
          if (bVar8) goto LAB_00115cf0;
          in_stack_ffffffffffffff28 =
               SDL_ReportAssertion(&FACTWaveBank_Prepare::sdl_assert_data_5,"FACTWaveBank_Prepare",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                   ,0x7a3);
        } while (in_stack_ffffffffffffff28 == 0);
        if (in_stack_ffffffffffffff28 == 1) {
          pcVar7 = (code *)swi(3);
          uVar3 = (*pcVar7)();
          return uVar3;
        }
      }
LAB_00115cf0:
      uVar6 = (**(code **)(*in_RDI + 200))(*(undefined4 *)(*in_R9 + 0x2c));
      *(undefined8 *)(*in_R9 + 0x38) = uVar6;
      *(uint *)(*in_R9 + 0x30) = puVar5[2];
      FACT_INTERNAL_OnBufferEnd(callback,(void *)CONCAT44(uVar11,uVar10));
    }
    LinkedList_AddEntry(in_stack_ffffffffffffff40,
                        (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (FAudioMutex)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (FAudioMallocFunc)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    FAudio_PlatformUnlockMutex((FAudioMutex)0x115f1e);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_Prepare(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags,
	uint32_t dwPlayOffset,
	uint8_t nLoopCount,
	FACTWave **ppWave
) {
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FAudioVoiceSends sends;
	FAudioSendDescriptor send;
	union
	{
		FAudioWaveFormatEx pcm;
		FAudioADPCMWaveFormat adpcm;
		FAudioXMA2WaveFormat xma2;
	} format;
	FACTWaveBankEntry *entry;
	FACTSeekTable *seek;
	if (pWaveBank == NULL)
	{
		*ppWave = NULL;
		return 1;
	}

	*ppWave = (FACTWave*) pWaveBank->parentEngine->pMalloc(sizeof(FACTWave));

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	/* Engine references */
	(*ppWave)->parentBank = pWaveBank;
	(*ppWave)->parentCue = NULL;
	(*ppWave)->index = nWaveIndex;
	(*ppWave)->notifyOnDestroy = 0;
	(*ppWave)->usercontext = NULL;

	/* Playback */
	(*ppWave)->state = FACT_STATE_PREPARED;
	(*ppWave)->volume = 1.0f;
	(*ppWave)->pitch = 0;
	(*ppWave)->loopCount = nLoopCount;

	/* TODO: Convert dwPlayOffset to a byte offset */
	FAudio_assert(dwPlayOffset == 0);
#if 0
	if (dwFlags & FACT_FLAG_UNITS_MS)
	{
		dwPlayOffset = (uint32_t) (
			( /* Samples per millisecond... */
				(float) entry->Format.nSamplesPerSec /
				1000.0f
			) * (float) dwPlayOffset
		);
	}
#endif

	/* Create the voice */
	send.Flags = 0;
	send.pOutputVoice = pWaveBank->parentEngine->master;
	sends.SendCount = 1;
	sends.pSends = &send;
	format.pcm.nChannels = entry->Format.nChannels;
	format.pcm.nSamplesPerSec = entry->Format.nSamplesPerSec;
	if (entry->Format.wFormatTag == 0x0)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_PCM;
		format.pcm.wBitsPerSample = 8 << entry->Format.wBitsPerSample;
		format.pcm.nBlockAlign = format.pcm.nChannels * format.pcm.wBitsPerSample / 8;
		format.pcm.nAvgBytesPerSec = format.pcm.nBlockAlign * format.pcm.nSamplesPerSec;
		format.pcm.cbSize = 0;
	}
	else if (entry->Format.wFormatTag == 0x1)
	{
		/* XMA2 is quite similar to WMA Pro... is what everyone thought.
		 * What a great way to start this comment.
		 *
		 * Let's reconstruct the extra data because who knows what decoder we're dealing with in <present year>.
		 * It's also a good exercise in understanding XMA2 metadata and feeding blocks into the decoder properly.
		 * At the time of writing this patch, it's FFmpeg via gstreamer which doesn't even respect most of this.
		 * ... which means: good luck to whoever ends up finding inaccuracies here in the future!
		 *
		 * dwLoopLength seems to match dwPlayLength in everything I've seen that had bLoopCount == 0.
		 * dwLoopBegin can be > 0 even with bLoopCount == 0 because why not. Let's ignore that.
		 *
		 * dwSamplesEncoded is usually close to dwPlayLength but not always (if ever?) equal. Let's assume equality.
		 * The XMA2 seek table uses sample indices as opposed to WMA's byte index seek table.
		 *
		 * nBlockAlign uses aWMABlockAlign given the entire WMA Pro thing BUT it's expected to be the block size for decoding.
		 * The XMA2 block size MUST be a multiple of 2048 BUT entry->PlayRegion.dwLength / seek->entryCount doesn't respect that.
		 * And even when correctly guesstimating the block size, we sometimes end up with block sizes >= 64k BYTES. nBlockAlign IS 16-BIT!
		 * Scrap nBlockAlign. I've given up and made all FAudio gstreamer functions use dwBytesPerBlock if available.
		 * Still though, if we don't want FAudio_INTERNAL_DecodeGSTREAMER to hang, the total data length must match (see SoundEffect.cs in FNA).
		 * As such, we round up when guessing the block size, feed GStreamer with zeroes^Wundersized blocks and hope for the best.
		 *
		 * This is FUN.
		 * -ade
		 */
		FAudio_assert(entry->Format.wBitsPerSample != 0);

		seek = &pWaveBank->seekTables[nWaveIndex];
		format.pcm.wFormatTag = FAUDIO_FORMAT_XMAUDIO2;
		format.pcm.wBitsPerSample = 16;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.cbSize = (
			sizeof(FAudioXMA2WaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.xma2.wNumStreams = (format.pcm.nChannels + 1) / 2;
		format.xma2.dwChannelMask = format.pcm.nChannels > 1 ? 0xFFFFFFFF >> (32 - format.pcm.nChannels) : 0;
		format.xma2.dwSamplesEncoded = seek->entries[seek->entryCount - 1];
		format.xma2.dwBytesPerBlock = (uint16_t) FAudio_ceil(
			(double) entry->PlayRegion.dwLength /
			(double) seek->entryCount /
			2048.0
		) * 2048;
		format.xma2.dwPlayBegin = format.xma2.dwLoopBegin = 0;
		format.xma2.dwPlayLength = format.xma2.dwLoopLength = format.xma2.dwSamplesEncoded;
		format.xma2.bLoopCount = 0;
		format.xma2.bEncoderVersion = 4;
		format.xma2.wBlockCount = seek->entryCount;
	}
	else if (entry->Format.wFormatTag == 0x2)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_MSADPCM;
		format.pcm.nBlockAlign = (entry->Format.wBlockAlign + 22) * format.pcm.nChannels;
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = (
			sizeof(FAudioADPCMWaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.adpcm.wSamplesPerBlock = (
			((format.pcm.nBlockAlign / format.pcm.nChannels) - 6) * 2
		);
	}
	else if (entry->Format.wFormatTag == 0x3)
	{
		/* Apparently this is used to detect WMA Pro...? */
		FAudio_assert(entry->Format.wBitsPerSample == 0);

		format.pcm.wFormatTag = FAUDIO_FORMAT_WMAUDIO2;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = 0;
	}
	else
	{
		FAudio_assert(0 && "Rebuild your WaveBanks with ADPCM!");
	}
	(*ppWave)->callback.callback.OnBufferEnd = pWaveBank->streaming ?
		FACT_INTERNAL_OnBufferEnd :
		NULL;
	(*ppWave)->callback.callback.OnBufferStart = NULL;
	(*ppWave)->callback.callback.OnLoopEnd = NULL;
	(*ppWave)->callback.callback.OnStreamEnd = FACT_INTERNAL_OnStreamEnd;
	(*ppWave)->callback.callback.OnVoiceError = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassEnd = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassStart = NULL;
	(*ppWave)->callback.wave = *ppWave;
	(*ppWave)->srcChannels = format.pcm.nChannels;
	FAudio_CreateSourceVoice(
		pWaveBank->parentEngine->audio,
		&(*ppWave)->voice,
		&format.pcm,
		FAUDIO_VOICE_USEFILTER, /* FIXME: Can this be optional? */
		4.0f,
		(FAudioVoiceCallback*) &(*ppWave)->callback,
		&sends,
		NULL
	);
	if (pWaveBank->streaming)
	{
		/* Init stream cache info */
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_PCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec *
				format.pcm.nBlockAlign
			);
		}
		else if (format.pcm.wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec /
				format.adpcm.wSamplesPerBlock *
				format.pcm.nBlockAlign
			);
		}
		else
		{
			/* Screw it, load the whole thing */
			(*ppWave)->streamSize = entry->PlayRegion.dwLength;

			/* XACT does NOT support loop subregions for these formats */
			FAudio_assert(entry->LoopRegion.dwStartSample == 0);
			FAudio_assert(entry->LoopRegion.dwTotalSamples == 0 || entry->LoopRegion.dwTotalSamples == entry->Duration);
		}
		(*ppWave)->streamCache = (uint8_t*) pWaveBank->parentEngine->pMalloc(
			(*ppWave)->streamSize
		);
		(*ppWave)->streamOffset = entry->PlayRegion.dwOffset;

		/* Read and submit first buffer from the WaveBank */
		FACT_INTERNAL_OnBufferEnd(&(*ppWave)->callback.callback, NULL);
	}
	else
	{
		(*ppWave)->streamCache = NULL;

		buffer.Flags = FAUDIO_END_OF_STREAM;
		buffer.AudioBytes = entry->PlayRegion.dwLength;
		buffer.pAudioData = FAudio_memptr(
			pWaveBank->io,
			entry->PlayRegion.dwOffset
		);
		buffer.PlayBegin = 0;
		buffer.PlayLength = entry->Duration;
		if (nLoopCount == 0)
		{
			buffer.LoopBegin = 0;
			buffer.LoopLength = 0;
			buffer.LoopCount = 0;
		}
		else
		{
			buffer.LoopBegin = entry->LoopRegion.dwStartSample;
			buffer.LoopLength = entry->LoopRegion.dwTotalSamples;
			buffer.LoopCount = nLoopCount;
		}
		buffer.pContext = NULL;
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			bufferWMA.pDecodedPacketCumulativeBytes =
				pWaveBank->seekTables[nWaveIndex].entries;
			bufferWMA.PacketCount =
				pWaveBank->seekTables[nWaveIndex].entryCount;
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				&bufferWMA
			);
		}
		else
		{
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				NULL
			);
		}
	}

	/* Add to the WaveBank Wave list */
	LinkedList_AddEntry(
		&pWaveBank->waveList,
		*ppWave,
		pWaveBank->waveLock,
		pWaveBank->parentEngine->pMalloc
	);

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}